

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

BeagleImpl * __thiscall
beagle::cpu::BeagleCPUImplFactory<double>::createImpl
          (BeagleCPUImplFactory<double> *this,int tipCount,int partialsBufferCount,
          int compactBufferCount,int stateCount,int patternCount,int eigenBufferCount,
          int matrixBufferCount,int categoryCount,int scaleBufferCount,int resourceNumber,
          int pluginResourceNumber,long preferenceFlags,long requirementFlags,int *errorCode)

{
  int iVar1;
  BeagleCPUImpl<double,_1,_0> *this_00;
  
  this_00 = (BeagleCPUImpl<double,_1,_0> *)operator_new(0x178);
  this_00->grandNumeratorDerivTmp = (double *)0x0;
  this_00->crossProductNumeratorTmp = (double *)0x0;
  this_00->outLogLikelihoodsTmp = (double *)0x0;
  this_00->outFirstDerivativesTmp = (double *)0x0;
  this_00->outSecondDerivativesTmp = (double *)0x0;
  this_00->ones = (double *)0x0;
  this_00->zeros = (double *)0x0;
  this_00->kNumThreads = 0;
  this_00->kThreadingEnabled = false;
  this_00->kAutoPartitioningEnabled = false;
  this_00->kAutoRootPartitioningEnabled = false;
  this_00->field_0x13f = 0;
  (this_00->super_BeagleImpl)._vptr_BeagleImpl = (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_BeagleImpl).resourceNumber = 0;
  this_00->kTipCount = 0;
  this_00->kPatternCount = 0;
  this_00->kPaddedPatternCount = 0;
  this_00->kExtraPatterns = 0;
  this_00->kMatrixCount = 0;
  this_00->kStateCount = 0;
  this_00->kTransPaddedStateCount = 0;
  this_00->kPartialsPaddedStateCount = 0;
  this_00->kEigenDecompCount = 0;
  this_00->kCategoryCount = 0;
  this_00->kScaleBufferCount = 0;
  this_00->kPartialsSize = 0;
  this_00->kMatrixSize = 0;
  this_00->kInternalPartialsBufferCount = 0;
  this_00->kPartitionCount = 0;
  this_00->kMaxPartitionCount = 0;
  this_00->kPartitionsInitialised = false;
  this_00->kPatternsReordered = false;
  *(undefined2 *)&this_00->field_0x52 = 0;
  this_00->kMinPatternCount = 0;
  this_00->kFlags = 0;
  this_00->realtypeMin = 0.0;
  *(undefined8 *)&this_00->scalingExponentThreshold = 0;
  this_00->gEigenDecomposition = (EigenDecomposition<double,_1> *)0x0;
  this_00->gCategoryRates = (double **)0x0;
  this_00->gPatternWeights = (double *)0x0;
  this_00->gPatternPartitions = (int *)0x0;
  this_00->gPatternPartitionsStartPatterns = (int *)0x0;
  this_00->gPatternsNewOrder = (int *)0x0;
  this_00->gCategoryWeights = (double **)0x0;
  this_00->gStateFrequencies = (double **)0x0;
  this_00->gPartials = (double **)0x0;
  this_00->gTipStates = (int **)0x0;
  this_00->gScaleBuffers = (double **)0x0;
  this_00->gAutoScaleBuffers = (short **)0x0;
  this_00->gActiveScalingFactors = (int *)0x0;
  this_00->gTransitionMatrices = (double **)0x0;
  this_00->integrationTmp = (double *)0x0;
  this_00->firstDerivTmp = (double *)0x0;
  this_00->secondDerivTmp = (double *)0x0;
  this_00->grandDenominatorDerivTmp = (double *)0x0;
  this_00->kNumThreads = 0;
  this_00->kThreadingEnabled = false;
  this_00->kAutoPartitioningEnabled = false;
  this_00->kAutoRootPartitioningEnabled = false;
  this_00->field_0x13f = 0;
  this_00->gThreads = (threadData *)0x0;
  this_00->gThreadOperations = (int **)0x0;
  this_00->gThreadOpCounts = (int *)0x0;
  this_00->gAutoPartitionOperations = (int *)0x0;
  this_00->gAutoPartitionIndices = (int *)0x0;
  this_00->gAutoPartitionOutSumLogLikelihoods = (double *)0x0;
  this_00->gFutures = (shared_future<void> *)0x0;
  (this_00->super_BeagleImpl)._vptr_BeagleImpl = (_func_int **)&PTR__BeagleCPUImpl_00158978;
  iVar1 = BeagleCPUImpl<double,_1,_0>::createInstance
                    (this_00,tipCount,partialsBufferCount,compactBufferCount,stateCount,patternCount
                     ,eigenBufferCount,matrixBufferCount,categoryCount,scaleBufferCount,
                     resourceNumber,pluginResourceNumber,preferenceFlags,requirementFlags);
  *errorCode = iVar1;
  if (iVar1 != 0) {
    (*(this_00->super_BeagleImpl)._vptr_BeagleImpl[1])(this_00);
    this_00 = (BeagleCPUImpl<double,_1,_0> *)0x0;
  }
  return &this_00->super_BeagleImpl;
}

Assistant:

BEAGLE_CPU_FACTORY_TEMPLATE
BeagleImpl* BeagleCPUImplFactory<BEAGLE_CPU_FACTORY_GENERIC>::createImpl(int tipCount,
                                             int partialsBufferCount,
                                             int compactBufferCount,
                                             int stateCount,
                                             int patternCount,
                                             int eigenBufferCount,
                                             int matrixBufferCount,
                                             int categoryCount,
                                             int scaleBufferCount,
                                             int resourceNumber,
                                             int pluginResourceNumber,
                                             long preferenceFlags,
                                             long requirementFlags,
                                             int* errorCode) {

    BeagleImpl* impl = new BeagleCPUImpl<REALTYPE, T_PAD_DEFAULT, P_PAD_DEFAULT>();

    try {
        *errorCode =
            impl->createInstance(tipCount, partialsBufferCount, compactBufferCount, stateCount,
                                 patternCount, eigenBufferCount, matrixBufferCount,
                                 categoryCount,scaleBufferCount, resourceNumber,
                                 pluginResourceNumber,
                                 preferenceFlags, requirementFlags);
        if (*errorCode == BEAGLE_SUCCESS) {
            return impl;
        }
        delete impl;
        return NULL;
    }
    catch(...) {
        if (DEBUGGING_OUTPUT)
            std::cerr << "exception in initialize\n";
        delete impl;
        throw;
    }

    delete impl;

    return NULL;
}